

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

SHADER_TYPE Diligent::GetShaderTypeFromPipelineIndex(Int32 Index,PIPELINE_TYPE PipelineType)

{
  Char *pCVar1;
  char (*in_R8) [50];
  undefined1 local_e8 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Int32 local_10;
  SHADER_TYPE SStack_c;
  PIPELINE_TYPE PipelineType_local;
  Int32 Index_local;
  
  msg.field_2._M_local_buf[0xf] = PipelineType;
  local_10 = Index;
  switch(PipelineType) {
  case PIPELINE_TYPE_GRAPHICS:
    switch(Index) {
    case 0:
      SStack_c = SHADER_TYPE_VERTEX;
      break;
    case 1:
      SStack_c = SHADER_TYPE_HULL;
      break;
    case 2:
      SStack_c = SHADER_TYPE_DOMAIN;
      break;
    case 3:
      SStack_c = SHADER_TYPE_GEOMETRY;
      break;
    case 4:
      SStack_c = SHADER_TYPE_PIXEL;
      break;
    default:
      FormatString<char[7],int,char[47]>
                ((string *)local_38,(Diligent *)"Index ",(char (*) [7])&local_10,
                 (int *)" is not a valid graphics pipeline shader index",(char (*) [47])in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetShaderTypeFromPipelineIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x8d2);
      std::__cxx11::string::~string((string *)local_38);
      SStack_c = SHADER_TYPE_UNKNOWN;
    }
    break;
  case PIPELINE_TYPE_COMPUTE:
    if (Index == 0) {
      SStack_c = SHADER_TYPE_COMPUTE;
    }
    else {
      FormatString<char[7],int,char[46]>
                ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Index ",(char (*) [7])&local_10,
                 (int *)" is not a valid compute pipeline shader index",(char (*) [46])in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetShaderTypeFromPipelineIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x8dc);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      SStack_c = SHADER_TYPE_UNKNOWN;
    }
    break;
  case PIPELINE_TYPE_MESH:
    if (Index == 0) {
      SStack_c = SHADER_TYPE_AMPLIFICATION;
    }
    else if (Index == 1) {
      SStack_c = SHADER_TYPE_MESH;
    }
    else if (Index == 4) {
      SStack_c = SHADER_TYPE_PIXEL;
    }
    else {
      FormatString<char[7],int,char[43]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Index ",(char (*) [7])&local_10,
                 (int *)" is not a valid mesh pipeline shader index",(char (*) [43])in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetShaderTypeFromPipelineIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x8e8);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      SStack_c = SHADER_TYPE_UNKNOWN;
    }
    break;
  case PIPELINE_TYPE_RAY_TRACING:
    switch(Index) {
    case 0:
      SStack_c = SHADER_TYPE_RAY_GEN;
      break;
    case 1:
      SStack_c = SHADER_TYPE_RAY_MISS;
      break;
    case 2:
      SStack_c = SHADER_TYPE_RAY_CLOSEST_HIT;
      break;
    case 3:
      SStack_c = SHADER_TYPE_RAY_ANY_HIT;
      break;
    case 4:
      SStack_c = SHADER_TYPE_RAY_INTERSECTION;
      break;
    case 5:
      SStack_c = SHADER_TYPE_CALLABLE;
      break;
    default:
      FormatString<char[7],int,char[50]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Index ",(char (*) [7])&local_10,
                 (int *)" is not a valid ray tracing pipeline shader index",in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetShaderTypeFromPipelineIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x8f7);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      SStack_c = SHADER_TYPE_UNKNOWN;
    }
    break;
  case PIPELINE_TYPE_LAST:
    if (Index == 0) {
      SStack_c = SHADER_TYPE_LAST;
    }
    else {
      FormatString<char[7],int,char[43]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Index ",(char (*) [7])&local_10,
                 (int *)" is not a valid tile pipeline shader index",(char (*) [43])in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"GetShaderTypeFromPipelineIndex",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x901);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      SStack_c = SHADER_TYPE_UNKNOWN;
    }
    break;
  default:
    FormatString<char[25]>((string *)local_e8,(char (*) [25])"Unexpected pipeline type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetShaderTypeFromPipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x906);
    std::__cxx11::string::~string((string *)local_e8);
    SStack_c = SHADER_TYPE_UNKNOWN;
  }
  return SStack_c;
}

Assistant:

SHADER_TYPE GetShaderTypeFromPipelineIndex(Int32 Index, PIPELINE_TYPE PipelineType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
            switch (Index)
            {
                case 0: return SHADER_TYPE_VERTEX;
                case 1: return SHADER_TYPE_HULL;
                case 2: return SHADER_TYPE_DOMAIN;
                case 3: return SHADER_TYPE_GEOMETRY;
                case 4: return SHADER_TYPE_PIXEL;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid graphics pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_COMPUTE:
            switch (Index)
            {
                case 0: return SHADER_TYPE_COMPUTE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid compute pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_MESH:
            switch (Index)
            {
                case 0: return SHADER_TYPE_AMPLIFICATION;
                case 1: return SHADER_TYPE_MESH;
                case 4: return SHADER_TYPE_PIXEL;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid mesh pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_RAY_TRACING:
            switch (Index)
            {
                case 0: return SHADER_TYPE_RAY_GEN;
                case 1: return SHADER_TYPE_RAY_MISS;
                case 2: return SHADER_TYPE_RAY_CLOSEST_HIT;
                case 3: return SHADER_TYPE_RAY_ANY_HIT;
                case 4: return SHADER_TYPE_RAY_INTERSECTION;
                case 5: return SHADER_TYPE_CALLABLE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid ray tracing pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        case PIPELINE_TYPE_TILE:
            switch (Index)
            {
                case 0: return SHADER_TYPE_TILE;

                default:
                    UNEXPECTED("Index ", Index, " is not a valid tile pipeline shader index");
                    return SHADER_TYPE_UNKNOWN;
            }

        default:
            UNEXPECTED("Unexpected pipeline type");
            return SHADER_TYPE_UNKNOWN;
    }
}